

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O0

yajl_val value_alloc(yajl_type type)

{
  yajl_type in_EDI;
  yajl_val v;
  yajl_val local_8;
  
  local_8 = (yajl_val)malloc(0x28);
  if (local_8 == (yajl_val)0x0) {
    local_8 = (yajl_val)0x0;
  }
  else {
    memset(local_8,0,0x28);
    local_8->type = in_EDI;
  }
  return local_8;
}

Assistant:

static yajl_val value_alloc (yajl_type type)
{
    yajl_val v;

    v = malloc (sizeof (*v));
    if (v == NULL) return (NULL);
    memset (v, 0, sizeof (*v));
    v->type = type;

    return (v);
}